

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_pmul_b_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  uintptr_t i;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar2 = (ulong)uVar1;
  for (uVar3 = 0; uVar3 != uVar1 >> 3; uVar3 = uVar3 + 1) {
    uVar6 = *(ulong *)((long)vn + uVar3 * 8);
    uVar7 = *(ulong *)((long)vm + uVar3 * 8);
    lVar4 = 8;
    uVar5 = 0;
    while (bVar8 = lVar4 != 0, lVar4 = lVar4 + -1, bVar8) {
      uVar5 = uVar5 ^ (uVar6 & 0x101010101010101) * 0xff & uVar7;
      uVar7 = uVar7 * 2 & 0xfefefefefefefefe;
      uVar6 = uVar6 >> 1;
    }
    *(ulong *)((long)vd + uVar3 * 8) = uVar5;
  }
  for (; uVar2 < (desc >> 2 & 0xf8) + 8; uVar2 = uVar2 + 8) {
    *(undefined8 *)((long)vd + uVar2) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_pmul_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, j, opr_sz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; ++i) {
        uint64_t nn = n[i];
        uint64_t mm = m[i];
        uint64_t rr = 0;

        for (j = 0; j < 8; ++j) {
            uint64_t mask = (nn & 0x0101010101010101ull) * 0xff;
            rr ^= mm & mask;
            mm = (mm << 1) & 0xfefefefefefefefeull;
            nn >>= 1;
        }
        d[i] = rr;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}